

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void Commands::Book(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  World *pWVar1;
  pointer pbVar2;
  pointer pcVar3;
  Quest_Context *pQVar4;
  _Base_ptr p_Var5;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  Character *this;
  Quest *pQVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_header *p_Var11;
  size_t size_guess;
  PacketBuilder reply;
  string rank_str;
  string guild_str;
  string home_str;
  string local_128;
  undefined1 local_108 [48];
  Character *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pWVar1 = from->world;
  pbVar2 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + pbVar2->_M_string_length);
  this = World::GetCharacter(pWVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this == (Character *)0x0) {
    pWVar1 = from->world;
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"character_not_found","");
    I18N::Format<>(&local_70,&pWVar1->i18n,(string *)local_108);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)local_108._0_8_;
    if ((undefined1 *)local_108._0_8_ == local_108 + 0x10) {
      return;
    }
  }
  else {
    Character::HomeString_abi_cxx11_(&local_90,this);
    Character::GuildNameString_abi_cxx11_(&local_b0,this);
    Character::GuildRankString_abi_cxx11_(&local_d0,this);
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_128,this);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)local_108,PACKET_BOOK,PACKET_REPLY,
               local_d0._M_string_length +
               local_128._M_string_length + local_90._M_string_length +
               (this->partner)._M_string_length + (this->title)._M_string_length +
               local_b0._M_string_length + 0xd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_128,this);
    PacketBuilder::AddBreakString((PacketBuilder *)local_108,&local_128,0xff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    PacketBuilder::AddBreakString((PacketBuilder *)local_108,&local_90,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_108,&this->partner,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_108,&this->title,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_108,&local_b0,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_108,&local_d0,0xff);
    iVar8 = Character::PlayerID(this);
    PacketBuilder::AddShort((PacketBuilder *)local_108,iVar8);
    PacketBuilder::AddChar((PacketBuilder *)local_108,(uint)this->clas);
    PacketBuilder::AddChar((PacketBuilder *)local_108,(uint)this->gender);
    PacketBuilder::AddChar((PacketBuilder *)local_108,0);
    iVar8 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
    if ((byte)iVar8 < 4) {
      iVar8 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
      if ((char)iVar8 == '\0') {
        iVar8 = 6;
        if (this->party == (Party *)0x0) {
          iVar8 = 0;
        }
      }
      else {
        iVar8 = (uint)(this->party != (Party *)0x0) * 5 + 4;
      }
    }
    else {
      iVar8 = (uint)(this->party != (Party *)0x0) * 5 + 5;
    }
    PacketBuilder::AddChar((PacketBuilder *)local_108,iVar8);
    PacketBuilder::AddByte((PacketBuilder *)local_108,0xff);
    p_Var11 = &(this->quests)._M_t._M_impl.super__Rb_tree_header;
    size_guess = 0;
    local_d8 = from;
    for (p_Var10 = (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != p_Var11;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      pQVar4 = (Quest_Context *)p_Var10[1]._M_parent;
      p_Var5 = p_Var10[1]._M_left;
      if (p_Var5 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var5->_M_parent = *(int *)&p_Var5->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var5->_M_parent = *(int *)&p_Var5->_M_parent + 1;
        }
      }
      if (((pQVar4 != (Quest_Context *)0x0) &&
          (bVar7 = EOPlus::Context::Finished((Context *)pQVar4), bVar7)) &&
         (bVar7 = Quest_Context::IsHidden(pQVar4), !bVar7)) {
        pQVar9 = Quest_Context::GetQuest(pQVar4);
        Quest::Name_abi_cxx11_(&local_128,pQVar9);
        sVar6 = local_128._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        size_guess = size_guess + sVar6 + 1;
      }
      if (p_Var5 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5);
      }
    }
    PacketBuilder::ReserveMore((PacketBuilder *)local_108,size_guess);
    for (p_Var10 = (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != p_Var11;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      pQVar4 = (Quest_Context *)p_Var10[1]._M_parent;
      p_Var5 = p_Var10[1]._M_left;
      if (p_Var5 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var5->_M_parent = *(int *)&p_Var5->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var5->_M_parent = *(int *)&p_Var5->_M_parent + 1;
        }
      }
      if (((pQVar4 != (Quest_Context *)0x0) &&
          (bVar7 = EOPlus::Context::Finished((Context *)pQVar4), bVar7)) &&
         (bVar7 = Quest_Context::IsHidden(pQVar4), !bVar7)) {
        pQVar9 = Quest_Context::GetQuest(pQVar4);
        Quest::Name_abi_cxx11_(&local_128,pQVar9);
        PacketBuilder::AddBreakString((PacketBuilder *)local_108,&local_128,0xff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      if (p_Var5 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5);
      }
    }
    Character::Send(local_d8,(PacketBuilder *)local_108);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_108._16_8_ = local_90.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
  }
  operator_delete(local_90._M_dataplus._M_p,local_108._16_8_ + 1);
  return;
}

Assistant:

void Book(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		std::string home_str = victim->HomeString();
		std::string guild_str = victim->GuildNameString();
		std::string rank_str = victim->GuildRankString();

		PacketBuilder reply(PACKET_BOOK, PACKET_REPLY,
			13 + victim->SourceName().length() + home_str.length() + victim->partner.length() + victim->title.length()
			+ guild_str.length() + rank_str.length());

		reply.AddBreakString(victim->SourceName());
		reply.AddBreakString(home_str);
		reply.AddBreakString(victim->partner);
		reply.AddBreakString(victim->title);
		reply.AddBreakString(guild_str);
		reply.AddBreakString(rank_str);
		reply.AddShort(victim->PlayerID());
		reply.AddChar(victim->clas);
		reply.AddChar(victim->gender);
		reply.AddChar(0);

		if (victim->SourceDutyAccess() >= ADMIN_HGM)
		{
			if (victim->party)
			{
				reply.AddChar(ICON_HGM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_HGM);
			}
		}
		else if (victim->SourceDutyAccess() >= ADMIN_GUIDE)
		{
			if (victim->party)
			{
				reply.AddChar(ICON_GM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_GM);
			}
		}
		else
		{
			if (victim->party)
			{
				reply.AddChar(ICON_PARTY);
			}
			else
			{
				reply.AddChar(ICON_NORMAL);
			}
		}

		reply.AddByte(255);

		std::size_t reserve = 0;

		UTIL_FOREACH(victim->quests, quest)
		{
			if (quest.second && quest.second->Finished() && !quest.second->IsHidden())
				reserve += quest.second->GetQuest()->Name().length() + 1;
		}

		reply.ReserveMore(reserve);

		UTIL_FOREACH(victim->quests, quest)
		{
			if (quest.second && quest.second->Finished() && !quest.second->IsHidden())
				reply.AddBreakString(quest.second->GetQuest()->Name());
		}

		from->Send(reply);
	}
}